

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowBase.cpp
# Opt level: O2

bool __thiscall sf::WindowBase::waitEvent(WindowBase *this,Event *event)

{
  bool bVar1;
  
  if ((this->m_impl != (WindowImpl *)0x0) &&
     (bVar1 = priv::WindowImpl::popEvent(this->m_impl,event,true), bVar1)) {
    filterEvent(this,event);
    return true;
  }
  return false;
}

Assistant:

bool WindowBase::waitEvent(Event& event)
{
    if (m_impl && m_impl->popEvent(event, true))
    {
        return filterEvent(event);
    }
    else
    {
        return false;
    }
}